

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O3

void encode_bc7_block(void *pBlock,bc7_optimization_results *pResults)

{
  byte *pbVar1;
  byte bVar2;
  undefined1 uVar3;
  uint uVar4;
  undefined4 uVar5;
  uint32_t uVar6;
  char cVar7;
  uint32_t subset;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  uint32_t i;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint32_t x;
  uint8_t *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint8_t *puVar19;
  uint uVar20;
  uint uVar21;
  undefined8 *puVar22;
  ulong uVar23;
  undefined8 *puVar24;
  bool bVar25;
  ulong local_b8;
  uint local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  uint local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_70;
  undefined8 uStack_68;
  color_quad_u8 high [3];
  int iStack_54;
  color_quad_u8 low [3];
  uint8_t color_selectors [16];
  uint8_t alpha_selectors [16];
  
  uVar4 = pResults->m_mode;
  uVar9 = (ulong)uVar4;
  bVar2 = "\x03\x02\x03\x02\x01\x01\x01\x02"[uVar9];
  local_70 = (ulong)bVar2;
  if (uVar9 - 4 < 3) {
    puVar19 = "";
  }
  else {
    if ((0x8aUL >> (uVar9 & 0x3f) & 1) == 0) {
      puVar19 = "";
    }
    else {
      puVar19 = "";
    }
    puVar19 = puVar19 + (pResults->m_partition << 4);
  }
  local_88 = *(undefined8 *)pResults->m_selectors;
  uStack_80 = *(undefined8 *)(pResults->m_selectors + 8);
  uStack_68 = *(undefined8 *)pResults->m_alpha_selectors;
  high._0_8_ = *(undefined8 *)(pResults->m_alpha_selectors + 8);
  puVar22 = &local_98;
  local_98 = *(undefined8 *)pResults->m_low;
  local_90 = *(undefined4 *)pResults->m_low[2].m_c;
  puVar24 = &local_a8;
  local_a8 = *(undefined8 *)pResults->m_high;
  local_a0 = *(undefined4 *)pResults->m_high[2].m_c;
  stack0xffffffffffffffb8 = pResults->m_pbits[2];
  stack0xffffffffffffffa8 = pResults->m_pbits[0];
  low._0_8_ = pResults->m_pbits[1];
  local_b0 = 0xffffffff;
  local_b8 = 0xffffffffffffffff;
  cVar7 = (char)pResults->m_index_selector;
  uVar20 = 1 << ("\x03\x03\x02\x02\x02\x02\x04\x02"[(int)uVar4] + cVar7 & 0x1f);
  uVar17 = 0;
  do {
    if (uVar17 == 0) {
      bVar10 = 0;
    }
    else {
      if (uVar17 == 1 && (uVar4 & 0xfffffffd) == 0) {
        uVar12 = (ulong)pResults->m_partition;
        puVar14 = 
        "\x03\x03\x0f\x0f\b\x03\x0f\x0f\b\b\x06\x06\x06\x05\x03\x03\x03\x03\b\x0f\x03\x03\x06\n\x05\b\b\x06\b\x05\x0f\x0f\b\x0f\x03\x05\x06\n\b\x0f\x0f\x03\x0f\x05\x0f\x0f\x0f\x0f\x03\x0f\x05\x05\x05\b\x05\n\x05\n\b\r\x0f\f\x03\x03"
        ;
      }
      else {
        uVar12 = (ulong)pResults->m_partition;
        if (uVar17 == 2 && (uVar4 & 0xfffffffd) == 0) {
          puVar14 = 
          "\x0f\b\b\x03\x0f\x0f\x03\b\x0f\x0f\x0f\x0f\x0f\x0f\x0f\b\x0f\b\x0f\x03\x0f\b\x0f\b\x03\x0f\x06\n\x0f\x0f\n\b\x0f\x03\x0f\n\n\b\t\n\x06\x0f\b\x0f\x03\x06\x06\b\x0f\x03\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x03\x0f\x0f\b"
          ;
        }
        else {
          puVar14 = 
          "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x02\b\x02\x02\b\b\x0f\x02\b\x02\x02\b\b\x02\x02\x0f\x0f\x06\b\x02\b\x0f\x0f\x02\b\x02\x02\x02\x0f\x0f\x06\x06\x02\x06\b\x0f\x0f\x02\x02\x0f\x0f\x0f\x0f\x0f\x02\x02\x0f"
          ;
        }
      }
      bVar10 = puVar14[uVar12];
    }
    *(uint *)((long)&local_b8 + uVar17 * 4) = (uint)bVar10;
    if ((uVar20 >> 1 & (uint)*(byte *)((long)&local_88 + (ulong)bVar10)) == 0) {
LAB_001083b1:
      if (((uVar4 & 0xfffffffe) == 4) &&
         (uVar18 = 1 << (""[(int)uVar4] - cVar7 & 0x1f),
         (uVar18 >> 1 & (uint)high[-2].m_c[bVar10]) != 0)) {
        lVar13 = 0;
        do {
          if (uVar17 == puVar19[lVar13]) {
            high[-2].m_c[lVar13] = ~high[-2].m_c[lVar13] + (char)uVar18;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x10);
        uVar3 = *(undefined1 *)((long)&local_98 + uVar17 * 4 + 3);
        *(undefined1 *)((long)&local_98 + uVar17 * 4 + 3) =
             *(undefined1 *)((long)&local_a8 + uVar17 * 4 + 3);
        *(undefined1 *)((long)&local_a8 + uVar17 * 4 + 3) = uVar3;
      }
    }
    else {
      lVar13 = 0;
      do {
        if (uVar17 == puVar19[lVar13]) {
          *(byte *)((long)&local_88 + lVar13) = ~*(byte *)((long)&local_88 + lVar13) + (char)uVar20;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
      if ((uVar4 & 0xfffffffe) == 4) {
        lVar13 = 0;
        do {
          uVar3 = *(undefined1 *)((long)puVar22 + lVar13);
          *(undefined1 *)((long)puVar22 + lVar13) = *(undefined1 *)((long)puVar24 + lVar13);
          *(undefined1 *)((long)puVar24 + lVar13) = uVar3;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
      }
      else {
        uVar5 = *(undefined4 *)((long)&local_98 + uVar17 * 4);
        *(undefined4 *)((long)&local_98 + uVar17 * 4) =
             *(undefined4 *)((long)&local_a8 + uVar17 * 4);
        *(undefined4 *)((long)&local_a8 + uVar17 * 4) = uVar5;
      }
      if (uVar4 != 1) {
        *(ulong *)(&iStack_54 + uVar17 * 2 + -1) =
             CONCAT44((int)*(undefined8 *)(&iStack_54 + uVar17 * 2 + -1),
                      (int)((ulong)*(undefined8 *)(&iStack_54 + uVar17 * 2 + -1) >> 0x20));
        goto LAB_001083b1;
      }
    }
    uVar17 = uVar17 + 1;
    puVar22 = (undefined8 *)((long)puVar22 + 4);
    puVar24 = (undefined8 *)((long)puVar24 + 4);
    if (uVar17 == (uint)bVar2 + (uint)(bVar2 == 0)) {
      *(undefined1 (*) [16])pBlock = (undefined1  [16])0x0;
      local_8c = 0;
      uVar17 = 0;
      uVar20 = uVar4 + 1;
      if (uVar20 != 0) {
        uVar18 = 1 << ((byte)uVar4 & 0x1f);
        uVar12 = 0;
        do {
          uVar11 = (uint)uVar12 & 7;
          uVar8 = 8 - uVar11;
          if (uVar20 <= uVar8) {
            uVar8 = uVar20;
          }
          uVar17 = (ulong)(uVar8 + (uint)uVar12);
          pbVar1 = (byte *)((long)pBlock + (uVar12 >> 3));
          *pbVar1 = *pbVar1 | (byte)(uVar18 << (sbyte)uVar11);
          uVar18 = uVar18 >> ((byte)uVar8 & 0x1f);
          uVar20 = uVar20 - uVar8;
          uVar12 = uVar17;
        } while (uVar20 != 0);
        bVar25 = (uVar4 & 0xfffffffe) == 4;
        local_8c = (uint)bVar25;
        if (bVar25) {
          uVar20 = pResults->m_rotation;
          uVar18 = 2;
          do {
            uVar11 = (uint)uVar12 & 7;
            uVar8 = 8 - uVar11;
            if (uVar18 <= uVar8) {
              uVar8 = uVar18;
            }
            uVar21 = uVar8 + (uint)uVar12;
            uVar17 = (ulong)uVar21;
            pbVar1 = (byte *)((long)pBlock + (uVar12 >> 3));
            *pbVar1 = *pbVar1 | (byte)(uVar20 << (sbyte)uVar11);
            uVar20 = uVar20 >> ((byte)uVar8 & 0x1f);
            uVar18 = uVar18 - uVar8;
            uVar12 = uVar17;
          } while (uVar18 != 0);
          if (uVar4 == 4) {
            pbVar1 = (byte *)((long)pBlock + (ulong)(uVar21 >> 3));
            *pbVar1 = *pbVar1 | (byte)(pResults->m_index_selector << ((byte)uVar21 & 7));
            uVar17 = (ulong)(uVar21 + 1);
          }
        }
        else {
          local_8c = 0;
        }
      }
      if (2 < uVar9 - 4) {
        uVar20 = pResults->m_partition;
        uVar18 = (uint)((0x8eUL >> (uVar9 & 0x3f) & 1) != 0) * 2 + 4;
        uVar12 = uVar17;
        do {
          uVar11 = (uint)uVar12 & 7;
          uVar8 = 8 - uVar11;
          if (uVar18 <= uVar8) {
            uVar8 = uVar18;
          }
          uVar21 = uVar8 + (uint)uVar12;
          uVar17 = (ulong)uVar21;
          pbVar1 = (byte *)((long)pBlock + (uVar12 >> 3));
          *pbVar1 = *pbVar1 | (byte)(uVar20 << (sbyte)uVar11);
          uVar20 = uVar20 >> ((byte)uVar8 & 0x1f);
          uVar12 = (ulong)uVar21;
          uVar18 = uVar18 - uVar8;
        } while (uVar18 != 0);
      }
      uVar12 = (ulong)((int)local_70 + (uint)((int)local_70 == 0));
      lVar13 = 0;
      do {
        uVar23 = 0;
        do {
          if (lVar13 == 3) {
            uVar20 = (uint)""[uVar9];
          }
          else {
            uVar20 = (uint)"\x04\x06\x05\a\x05\a\a\x05"[uVar9];
          }
          if (uVar20 != 0) {
            uVar18 = (uint)*(byte *)((long)&local_98 + uVar23 * 4 + lVar13);
            uVar15 = uVar17;
            do {
              uVar11 = (uint)uVar15 & 7;
              uVar8 = 8 - uVar11;
              if (uVar20 <= uVar8) {
                uVar8 = uVar20;
              }
              uVar21 = uVar8 + (uint)uVar15;
              uVar17 = (ulong)uVar21;
              pbVar1 = (byte *)((long)pBlock + (uVar15 >> 3));
              *pbVar1 = *pbVar1 | (byte)(uVar18 << (sbyte)uVar11);
              uVar18 = uVar18 >> ((byte)uVar8 & 0x1f);
              uVar15 = (ulong)uVar21;
              uVar20 = uVar20 - uVar8;
            } while (uVar20 != 0);
          }
          if (lVar13 == 3) {
            uVar20 = (uint)""[uVar9];
          }
          else {
            uVar20 = (uint)"\x04\x06\x05\a\x05\a\a\x05"[uVar9];
          }
          if (uVar20 != 0) {
            uVar18 = (uint)*(byte *)((long)&local_a8 + uVar23 * 4 + lVar13);
            uVar15 = uVar17;
            do {
              uVar11 = (uint)uVar15 & 7;
              uVar8 = 8 - uVar11;
              if (uVar20 <= uVar8) {
                uVar8 = uVar20;
              }
              uVar17 = (ulong)(uVar8 + (uint)uVar15);
              pbVar1 = (byte *)((long)pBlock + (uVar15 >> 3));
              *pbVar1 = *pbVar1 | (byte)(uVar18 << (sbyte)uVar11);
              uVar18 = uVar18 >> ((byte)uVar8 & 0x1f);
              uVar20 = uVar20 - uVar8;
              uVar15 = uVar17;
            } while (uVar20 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar12);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4 - (ulong)(uVar4 < 4));
      if ((0x34UL >> (uVar9 & 0x3f) & 1) == 0) {
        uVar9 = 0;
        do {
          pbVar1 = (byte *)((long)pBlock + (uVar17 >> 3));
          *pbVar1 = *pbVar1 | (byte)((&iStack_54)[uVar9 * 2 + -1] << ((byte)uVar17 & 7));
          uVar20 = (int)uVar17 + 1;
          if (uVar4 != 1) {
            pbVar1 = (byte *)((long)pBlock + (ulong)(uVar20 >> 3));
            *pbVar1 = *pbVar1 | (byte)((&iStack_54)[uVar9 * 2] << ((byte)uVar20 & 7));
            uVar20 = (int)uVar17 + 2;
          }
          uVar9 = uVar9 + 1;
          uVar17 = (ulong)uVar20;
        } while (uVar12 != uVar9);
      }
      else {
        uVar20 = (uint)uVar17;
      }
      lVar13 = 0;
      do {
        lVar16 = 0;
        do {
          uVar6 = pResults->m_index_selector;
          if (uVar6 == 0) {
            uVar18 = (uint)"\x03\x03\x02\x02\x02\x02\x04\x02"[(int)uVar4];
          }
          else {
            uVar18 = ""[(int)uVar4] - uVar6;
          }
          uVar9 = lVar16 + lVar13 * 4;
          uVar18 = uVar18 - (uVar9 == local_b0 ||
                            (uVar9 == local_b8 >> 0x20 || uVar9 == (local_b8 & 0xffffffff)));
          if (uVar18 != 0) {
            puVar22 = &uStack_68;
            if (uVar6 == 0) {
              puVar22 = &local_88;
            }
            uVar11 = (uint)*(byte *)((long)puVar22 + uVar9);
            uVar8 = uVar20;
            do {
              uVar21 = 8 - (uVar8 & 7);
              if (uVar18 <= uVar21) {
                uVar21 = uVar18;
              }
              uVar20 = uVar21 + uVar8;
              pbVar1 = (byte *)((long)pBlock + (ulong)(uVar8 >> 3));
              *pbVar1 = *pbVar1 | (byte)(uVar11 << (sbyte)(uVar8 & 7));
              uVar11 = uVar11 >> ((byte)uVar21 & 0x1f);
              uVar18 = uVar18 - uVar21;
              uVar8 = uVar20;
            } while (uVar18 != 0);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      if ((char)local_8c != '\0') {
        lVar13 = 0;
        do {
          lVar16 = 0;
          do {
            uVar6 = pResults->m_index_selector;
            if (uVar6 == 0) {
              uVar18 = (uint)""[(int)uVar4];
            }
            else {
              uVar18 = "\x03\x03\x02\x02\x02\x02\x04\x02"[(int)uVar4] + uVar6;
            }
            uVar9 = lVar16 + lVar13 * 4;
            uVar18 = uVar18 - (uVar9 == local_b0 ||
                              (uVar9 == local_b8 >> 0x20 || uVar9 == (local_b8 & 0xffffffff)));
            if (uVar18 != 0) {
              puVar22 = &local_88;
              if (uVar6 == 0) {
                puVar22 = &uStack_68;
              }
              uVar11 = (uint)*(byte *)((long)puVar22 + uVar9);
              uVar8 = uVar20;
              do {
                uVar21 = 8 - (uVar8 & 7);
                if (uVar18 <= uVar21) {
                  uVar21 = uVar18;
                }
                uVar20 = uVar21 + uVar8;
                pbVar1 = (byte *)((long)pBlock + (ulong)(uVar8 >> 3));
                *pbVar1 = *pbVar1 | (byte)(uVar11 << (sbyte)(uVar8 & 7));
                uVar11 = uVar11 >> ((byte)uVar21 & 0x1f);
                uVar18 = uVar18 - uVar21;
                uVar8 = uVar20;
              } while (uVar18 != 0);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 4);
      }
      return;
    }
  } while( true );
}

Assistant:

static void encode_bc7_block(void* pBlock, const bc7_optimization_results* pResults)
{
	assert(pResults->m_index_selector <= 1);
	assert(pResults->m_rotation <= 3);

	const uint32_t best_mode = pResults->m_mode;

	const uint32_t total_subsets = g_bc7_num_subsets[best_mode];
	const uint32_t total_partitions = 1 << g_bc7_partition_bits[best_mode];
	//const uint32_t num_rotations = 1 << g_bc7_rotation_bits[best_mode];
	//const uint32_t num_index_selectors = (best_mode == 4) ? 2 : 1;

	const uint8_t* pPartition;
	if (total_subsets == 1)
		pPartition = &g_bc7_partition1[0];
	else if (total_subsets == 2)
		pPartition = &g_bc7_partition2[pResults->m_partition * 16];
	else
		pPartition = &g_bc7_partition3[pResults->m_partition * 16];

	uint8_t color_selectors[16];
	memcpy(color_selectors, pResults->m_selectors, 16);

	uint8_t alpha_selectors[16];
	memcpy(alpha_selectors, pResults->m_alpha_selectors, 16);

	color_quad_u8 low[3], high[3];
	memcpy(low, pResults->m_low, sizeof(low));
	memcpy(high, pResults->m_high, sizeof(high));

	uint32_t pbits[3][2];
	memcpy(pbits, pResults->m_pbits, sizeof(pbits));

	int anchor[3] = { -1, -1, -1 };

	for (uint32_t k = 0; k < total_subsets; k++)
	{
		uint32_t anchor_index = 0;
		if (k)
		{
			if ((total_subsets == 3) && (k == 1))
				anchor_index = g_bc7_table_anchor_index_third_subset_1[pResults->m_partition];
			else if ((total_subsets == 3) && (k == 2))
				anchor_index = g_bc7_table_anchor_index_third_subset_2[pResults->m_partition];
			else
				anchor_index = g_bc7_table_anchor_index_second_subset[pResults->m_partition];
		}

		anchor[k] = anchor_index;

		const uint32_t color_index_bits = get_bc7_color_index_size(best_mode, pResults->m_index_selector);
		const uint32_t num_color_indices = 1 << color_index_bits;

		if (color_selectors[anchor_index] & (num_color_indices >> 1))
		{
			for (uint32_t i = 0; i < 16; i++)
				if (pPartition[i] == k)
					color_selectors[i] = (uint8_t)((num_color_indices - 1) - color_selectors[i]);

			if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
			{
				for (uint32_t q = 0; q < 3; q++)
				{
					uint8_t t = low[k].m_c[q];
					low[k].m_c[q] = high[k].m_c[q];
					high[k].m_c[q] = t;
				}
			}
			else
			{
				color_quad_u8 tmp = low[k];
				low[k] = high[k];
				high[k] = tmp;
			}

			if (!g_bc7_mode_has_shared_p_bits[best_mode])
			{
				uint32_t t = pbits[k][0];
				pbits[k][0] = pbits[k][1];
				pbits[k][1] = t;
			}
		}

		if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
		{
			const uint32_t alpha_index_bits = get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);
			const uint32_t num_alpha_indices = 1 << alpha_index_bits;

			if (alpha_selectors[anchor_index] & (num_alpha_indices >> 1))
			{
				for (uint32_t i = 0; i < 16; i++)
					if (pPartition[i] == k)
						alpha_selectors[i] = (uint8_t)((num_alpha_indices - 1) - alpha_selectors[i]);

				uint8_t t = low[k].m_c[3];
				low[k].m_c[3] = high[k].m_c[3];
				high[k].m_c[3] = t;
			}
		}
	}

	uint8_t* pBlock_bytes = (uint8_t*)(pBlock);
	memset(pBlock_bytes, 0, BC7ENC_BLOCK_SIZE);

	uint32_t cur_bit_ofs = 0;
	set_block_bits(pBlock_bytes, 1 << best_mode, best_mode + 1, &cur_bit_ofs);

	if ((best_mode == 4) || (best_mode == 5))
		set_block_bits(pBlock_bytes, pResults->m_rotation, 2, &cur_bit_ofs);

	if (best_mode == 4)
		set_block_bits(pBlock_bytes, pResults->m_index_selector, 1, &cur_bit_ofs);

	if (total_partitions > 1)
		set_block_bits(pBlock_bytes, pResults->m_partition, (total_partitions == 64) ? 6 : 4, &cur_bit_ofs);

	const uint32_t total_comps = (best_mode >= 4) ? 4 : 3;
	for (uint32_t comp = 0; comp < total_comps; comp++)
	{
		for (uint32_t subset = 0; subset < total_subsets; subset++)
		{
			set_block_bits(pBlock_bytes, low[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
			set_block_bits(pBlock_bytes, high[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
		}
	}

	if (g_bc7_mode_has_p_bits[best_mode])
	{
		for (uint32_t subset = 0; subset < total_subsets; subset++)
		{
			set_block_bits(pBlock_bytes, pbits[subset][0], 1, &cur_bit_ofs);
			if (!g_bc7_mode_has_shared_p_bits[best_mode])
				set_block_bits(pBlock_bytes, pbits[subset][1], 1, &cur_bit_ofs);
		}
	}

	for (uint32_t y = 0; y < 4; y++)
	{
		for (uint32_t x = 0; x < 4; x++)
		{
			int idx = x + y * 4;

			uint32_t n = pResults->m_index_selector ? get_bc7_alpha_index_size(best_mode, pResults->m_index_selector) : get_bc7_color_index_size(best_mode, pResults->m_index_selector);

			if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
				n--;

			set_block_bits(pBlock_bytes, pResults->m_index_selector ? alpha_selectors[idx] : color_selectors[idx], n, &cur_bit_ofs);
		}
	}

	if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
	{
		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				int idx = x + y * 4;

				uint32_t n = pResults->m_index_selector ? get_bc7_color_index_size(best_mode, pResults->m_index_selector) : get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);

				if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
					n--;

				set_block_bits(pBlock_bytes, pResults->m_index_selector ? color_selectors[idx] : alpha_selectors[idx], n, &cur_bit_ofs);
			}
		}
	}

	assert(cur_bit_ofs == 128);
}